

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O2

void free_aranges_chain(Dwarf_Debug dbg,Dwarf_Chain_conflict head)

{
  Dwarf_Chain_conflict cur;
  Dwarf_Chain_conflict space;
  
  if (head != (Dwarf_Chain_conflict)0x0) {
    while (space = head, space != (Dwarf_Chain_conflict)0x0) {
      head = space->ch_next;
      if (space->ch_itemtype != 0 && space->ch_item != (Dwarf_Ptr)0x0) {
        dwarf_dealloc(dbg,space->ch_item,(long)space->ch_itemtype);
        space->ch_item = (void *)0x0;
        dwarf_dealloc(dbg,space,0x1f);
      }
    }
  }
  return;
}

Assistant:

static void
free_aranges_chain(Dwarf_Debug dbg, Dwarf_Chain head)
{
    Dwarf_Chain cur = head;
    Dwarf_Chain next = 0;

    if (!head) {
        return;
    }
    next = head->ch_next;
    for ( ;cur; cur = next) {
        void *item = cur->ch_item;
        int  type = cur->ch_itemtype;

        next = cur->ch_next;
        if (item && type) {
            dwarf_dealloc(dbg,item,type);
            cur->ch_item = 0;
            dwarf_dealloc(dbg,cur,DW_DLA_CHAIN);
        }
    }
}